

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  char cVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterXsYs<signed_char> *pGVar9;
  TransformerLogLog *pTVar10;
  ImPlotPlot *pIVar11;
  GetterXsYRef<signed_char> *pGVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  int iVar19;
  long lVar20;
  ImDrawIdx IVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  float fVar27;
  float fVar28;
  undefined1 auVar26 [16];
  float fVar29;
  float fVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  pIVar17 = GImPlot;
  pGVar9 = this->Getter1;
  pTVar10 = this->Transformer;
  iVar19 = pGVar9->Count;
  lVar20 = (long)(((pGVar9->Offset + prim) % iVar19 + iVar19) % iVar19) * (long)pGVar9->Stride;
  cVar5 = pGVar9->Ys[lVar20];
  dVar24 = log10((double)(int)pGVar9->Xs[lVar20] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar11 = pIVar17->CurrentPlot;
  dVar1 = pIVar17->LogDenX;
  dVar2 = (pIVar11->XAxis).Range.Min;
  dVar3 = (pIVar11->XAxis).Range.Max;
  dVar25 = log10((double)(int)cVar5 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar19 = pTVar10->YAxis;
  pIVar11 = pIVar17->CurrentPlot;
  pGVar12 = this->Getter2;
  pTVar10 = this->Transformer;
  iVar6 = pGVar12->Count;
  auVar34._8_8_ = pIVar17->LogDenY[iVar19];
  auVar34._0_8_ = dVar1;
  auVar30._8_8_ = dVar25;
  auVar30._0_8_ = dVar24;
  dVar1 = pGVar12->YRef;
  auVar31 = divpd(auVar30,auVar34);
  dVar24 = pIVar11->YAxis[iVar19].Range.Min;
  IVar4 = pIVar17->PixelRange[iVar19].Min;
  fVar22 = (float)(pIVar17->Mx *
                   (((double)(float)auVar31._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar11->XAxis).Range.Min) + (double)IVar4.x);
  fVar27 = (float)(pIVar17->My[iVar19] *
                   (((double)(float)auVar31._8_8_ * (pIVar11->YAxis[iVar19].Range.Max - dVar24) +
                    dVar24) - dVar24) + (double)IVar4.y);
  dVar25 = log10((double)(int)pGVar12->Xs
                              [(long)(((prim + pGVar12->Offset) % iVar6 + iVar6) % iVar6) *
                               (long)pGVar12->Stride] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar11 = pIVar18->CurrentPlot;
  dVar2 = pIVar18->LogDenX;
  dVar3 = (pIVar11->XAxis).Range.Min;
  dVar24 = (pIVar11->XAxis).Range.Max;
  auVar26._0_8_ = log10(dVar1 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  iVar19 = pTVar10->YAxis;
  auVar26._8_8_ = dVar25;
  auVar15._8_4_ = SUB84(dVar2,0);
  auVar15._0_8_ = pIVar18->LogDenY[iVar19];
  auVar15._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar31 = divpd(auVar26,auVar15);
  pIVar11 = pIVar18->CurrentPlot;
  dVar1 = pIVar11->YAxis[iVar19].Range.Min;
  IVar4 = pIVar18->PixelRange[iVar19].Min;
  fVar23 = (float)(pIVar18->My[iVar19] *
                   (((double)(float)auVar31._0_8_ * (pIVar11->YAxis[iVar19].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar28 = (float)(pIVar18->Mx *
                   (((double)(float)auVar31._8_8_ * (dVar24 - dVar3) + dVar3) -
                   (pIVar11->XAxis).Range.Min) + (double)IVar4.x);
  auVar35._0_4_ = ~-(uint)(fVar28 <= fVar22) & (uint)fVar28;
  auVar35._4_4_ = ~-(uint)(fVar23 <= fVar27) & (uint)fVar23;
  auVar35._8_4_ = ~-(uint)(fVar22 < fVar28) & (uint)fVar28;
  auVar35._12_4_ = ~-(uint)(fVar27 < fVar23) & (uint)fVar23;
  auVar31._4_4_ = (uint)fVar27 & -(uint)(fVar23 <= fVar27);
  auVar31._0_4_ = (uint)fVar22 & -(uint)(fVar28 <= fVar22);
  auVar31._8_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar28);
  auVar31._12_4_ = (uint)fVar27 & -(uint)(fVar27 < fVar23);
  auVar35 = auVar35 | auVar31;
  fVar29 = (cull_rect->Min).y;
  auVar16._4_8_ = auVar35._8_8_;
  auVar16._0_4_ = -(uint)(auVar35._4_4_ < fVar29);
  auVar36._0_8_ = auVar16._0_8_ << 0x20;
  auVar36._8_4_ = -(uint)(auVar35._8_4_ < (cull_rect->Max).x);
  auVar36._12_4_ = -(uint)(auVar35._12_4_ < (cull_rect->Max).y);
  auVar37._4_4_ = -(uint)(fVar29 < auVar35._4_4_);
  auVar37._0_4_ = -(uint)((cull_rect->Min).x < auVar35._0_4_);
  auVar37._8_8_ = auVar36._8_8_;
  iVar19 = movmskps((int)cull_rect,auVar37);
  if (iVar19 == 0xf) {
    IVar7 = this->Col;
    IVar4 = *uv;
    fVar29 = fVar23 - fVar27;
    fVar32 = fVar28 - fVar22;
    fVar33 = fVar32 * fVar32 + fVar29 * fVar29;
    if (0.0 < fVar33) {
      fVar33 = 1.0 / SQRT(fVar33);
      fVar29 = fVar29 * fVar33;
      fVar32 = fVar32 * fVar33;
    }
    fVar33 = this->Weight * 0.5;
    pIVar13 = DrawList->_VtxWritePtr;
    fVar29 = fVar33 * fVar29;
    fVar33 = fVar33 * fVar32;
    (pIVar13->pos).x = fVar29 + fVar22;
    (pIVar13->pos).y = fVar27 - fVar33;
    (pIVar13->uv).x = IVar4.x;
    (pIVar13->uv).y = IVar4.y;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar7;
    pIVar13[1].pos.x = fVar29 + fVar28;
    pIVar13[1].pos.y = fVar23 - fVar33;
    pIVar13[1].uv = IVar4;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar7;
    pIVar13[2].pos.x = fVar28 - fVar29;
    pIVar13[2].pos.y = fVar33 + fVar23;
    pIVar13[2].uv = IVar4;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar7;
    pIVar13[3].pos.x = fVar22 - fVar29;
    pIVar13[3].pos.y = fVar33 + fVar27;
    pIVar13[3].uv = IVar4;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar21 = (ImDrawIdx)uVar8;
    *pIVar14 = IVar21;
    pIVar14[1] = IVar21 + 1;
    pIVar14[2] = IVar21 + 2;
    pIVar14[3] = IVar21;
    pIVar14[4] = IVar21 + 2;
    pIVar14[5] = IVar21 + 3;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  return (char)iVar19 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }